

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswTable.c
# Opt level: O2

Aig_Obj_t * Csw_TableCutLookup(Csw_Man_t *p,Csw_Cut_t *pCut)

{
  char cVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *pAVar8;
  ulong uVar9;
  long lVar10;
  Csw_Cut_t *pCVar11;
  
  uVar4 = Csw_CutHash(pCut);
  pCVar11 = (Csw_Cut_t *)(p->pTable + (int)(uVar4 % (uint)p->nTableSize));
  do {
    while( true ) {
      do {
        pCVar11 = pCVar11->pNext;
        if (pCVar11 == (Csw_Cut_t *)0x0) {
          return (Aig_Obj_t *)0x0;
        }
        cVar1 = pCVar11->nFanins;
      } while (((cVar1 != pCut->nFanins) || (pCVar11->uSign != pCut->uSign)) ||
              (iVar5 = bcmp(pCVar11 + 1,pCut + 1,(long)cVar1 * 4), iVar5 != 0));
      lVar6 = (long)pCVar11->nLeafMax;
      lVar10 = (long)pCut->nLeafMax;
      uVar9 = (ulong)(uint)(1 << (cVar1 - 5U & 0x1f));
      if (cVar1 < '\x06') {
        uVar9 = 1;
      }
      if (((*(uint *)((long)&pCut[1].pNext + lVar10 * 4) ^
           *(uint *)((long)&pCVar11[1].pNext + lVar6 * 4)) & 1) != 0) break;
      do {
        if ((int)uVar9 < 1) {
          pAVar7 = Aig_ManObj(p->pManRes,pCVar11->iNode);
          uVar4 = *(uint *)&pAVar7->field_0x18;
          pAVar8 = Aig_ManObj(p->pManRes,pCut->iNode);
          if (((uVar4 ^ *(uint *)&pAVar8->field_0x18) & 8) == 0) {
            return pAVar7;
          }
          __assert_fail("pRes->fPhase == Aig_ManObj( p->pManRes, pCut->iNode )->fPhase",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/csw/cswTable.c"
                        ,0x8e,"Aig_Obj_t *Csw_TableCutLookup(Csw_Man_t *, Csw_Cut_t *)");
        }
        lVar2 = uVar9 * 2;
        lVar3 = uVar9 * 2;
        uVar9 = uVar9 - 1;
      } while (*(int *)(&pCVar11->nCutSize + lVar6 * 2 + lVar2) ==
               *(int *)(&pCut->nCutSize + lVar10 * 2 + lVar3));
    }
    do {
      if ((int)uVar9 < 1) {
        pAVar7 = Aig_ManObj(p->pManRes,pCVar11->iNode);
        uVar4 = *(uint *)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18);
        pAVar8 = Aig_ManObj(p->pManRes,pCut->iNode);
        if (((uVar4 ^ *(uint *)&pAVar8->field_0x18) & 8) != 0) {
          return (Aig_Obj_t *)((ulong)pAVar7 ^ 1);
        }
        __assert_fail("Aig_Regular(pRes)->fPhase != Aig_ManObj( p->pManRes, pCut->iNode )->fPhase",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/csw/cswTable.c"
                      ,0x97,"Aig_Obj_t *Csw_TableCutLookup(Csw_Man_t *, Csw_Cut_t *)");
      }
      lVar2 = uVar9 * 2;
      lVar3 = uVar9 * 2;
      uVar9 = uVar9 - 1;
    } while ((*(uint *)(&pCut->nCutSize + lVar10 * 2 + lVar2) ^
             *(uint *)(&pCVar11->nCutSize + lVar6 * 2 + lVar3)) == 0xffffffff);
  } while( true );
}

Assistant:

Aig_Obj_t * Csw_TableCutLookup( Csw_Man_t * p, Csw_Cut_t * pCut )
{
    Aig_Obj_t * pRes = NULL;
    Csw_Cut_t * pEnt;
    unsigned * pTruthNew, * pTruthOld;
    int iEntry = Csw_CutHash(pCut) % p->nTableSize;
    for ( pEnt = p->pTable[iEntry]; pEnt; pEnt = pEnt->pNext )
    {
        if ( pEnt->nFanins != pCut->nFanins )
            continue;
        if ( pEnt->uSign != pCut->uSign )
            continue;
        if ( memcmp( pEnt->pFanins, pCut->pFanins, sizeof(int) * pCut->nFanins ) )
            continue;
        pTruthOld = Csw_CutTruth(pEnt);
        pTruthNew = Csw_CutTruth(pCut);
        if ( (pTruthOld[0] & 1) == (pTruthNew[0] & 1) )
        {
            if ( Kit_TruthIsEqual( pTruthOld, pTruthNew, pCut->nFanins ) )
            {
                pRes = Aig_ManObj( p->pManRes, pEnt->iNode );
                assert( pRes->fPhase == Aig_ManObj( p->pManRes, pCut->iNode )->fPhase );
                break;
            }
        }
        else
        {
            if ( Kit_TruthIsOpposite( pTruthOld, pTruthNew, pCut->nFanins ) )
            {
                pRes = Aig_Not( Aig_ManObj( p->pManRes, pEnt->iNode ) );
                assert( Aig_Regular(pRes)->fPhase != Aig_ManObj( p->pManRes, pCut->iNode )->fPhase );
                break;
            }
        }
    }
    return pRes;
}